

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O2

void __thiscall re2c::Linear::emit(Linear *this,OutputFile *o,uint32_t ind,bool *readCh)

{
  pointer ppVar1;
  Cond *compare;
  uint32_t ind_00;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  while( true ) {
    uVar3 = (ulong)uVar2;
    ppVar1 = (this->branches).
             super__Vector_base<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->branches).
                      super__Vector_base<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4) <= uVar3)
    break;
    compare = ppVar1[uVar3].first;
    ind_00 = ind;
    if (compare != (Cond *)0x0) {
      output_if(o,ind,readCh,&compare->compare,
                *(uint32_t *)&(((string *)&compare->value)->_M_dataplus)._M_p);
      ppVar1 = (this->branches).
               super__Vector_base<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ind_00 = 0;
    }
    output_goto(o,ind_00,readCh,(label_t)((ppVar1[uVar3].second)->label).value);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void Linear::emit (OutputFile & o, uint32_t ind, bool & readCh)
{
	for (uint32_t i = 0; i < branches.size (); ++i)
	{
		if (branches[i].first != NULL)
		{
			output_if (o, ind, readCh, branches[i].first->compare, branches[i].first->value);
			output_goto (o, 0, readCh, branches[i].second->label);
		}
		else
		{
			output_goto (o, ind, readCh, branches[i].second->label);
		}
	}
}